

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code llvm::sys::fs::createUniqueDirectory(Twine *Prefix,SmallVectorImpl<char> *ResultPath)

{
  error_code eVar1;
  Twine local_60;
  Twine local_48;
  int local_2c;
  SmallVectorImpl<char> *pSStack_28;
  int Dummy;
  SmallVectorImpl<char> *ResultPath_local;
  Twine *Prefix_local;
  
  pSStack_28 = ResultPath;
  ResultPath_local = (SmallVectorImpl<char> *)Prefix;
  Twine::Twine(&local_60,"-%%%%%%");
  llvm::operator+(&local_48,Prefix,&local_60);
  eVar1 = createUniqueEntity(&local_48,&local_2c,pSStack_28,true,0,FS_Dir,F_None);
  eVar1._4_4_ = 0;
  return eVar1;
}

Assistant:

std::error_code createUniqueDirectory(const Twine &Prefix,
                                      SmallVectorImpl<char> &ResultPath) {
  int Dummy;
  return createUniqueEntity(Prefix + "-%%%%%%", Dummy, ResultPath, true, 0,
                            FS_Dir);
}